

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O2

void __thiscall CNetBan::CNetHash::CNetHash(CNetHash *this,NETADDR_conflict *pAddr)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar2 = psadbw(ZEXT416(*(uint *)pAddr->ip),(undefined1  [16])0x0);
  uVar1 = auVar2._0_4_;
  if (pAddr->type != 1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(pAddr->ip + 4);
    auVar3 = psadbw(auVar3,(undefined1  [16])0x0);
    auVar4 = psadbw(ZEXT416(*(uint *)(pAddr->ip + 0xc)),(undefined1  [16])0x0);
    uVar1 = (uint)(byte)(auVar4[0] + auVar3[0] + auVar2[0]);
  }
  this->m_Hash = uVar1 & 0xff;
  this->m_HashIndex = 0;
  return;
}

Assistant:

CNetBan::CNetHash::CNetHash(const NETADDR *pAddr)
{
	if(pAddr->type==NETTYPE_IPV4)
		m_Hash = (pAddr->ip[0]+pAddr->ip[1]+pAddr->ip[2]+pAddr->ip[3])&0xFF;
	else
		m_Hash = (pAddr->ip[0]+pAddr->ip[1]+pAddr->ip[2]+pAddr->ip[3]+pAddr->ip[4]+pAddr->ip[5]+pAddr->ip[6]+pAddr->ip[7]+
			pAddr->ip[8]+pAddr->ip[9]+pAddr->ip[10]+pAddr->ip[11]+pAddr->ip[12]+pAddr->ip[13]+pAddr->ip[14]+pAddr->ip[15])&0xFF;
	m_HashIndex = 0;
}